

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.h
# Opt level: O2

int __thiscall TiXmlString::init(TiXmlString *this,EVP_PKEY_CTX *ctx)

{
  Rep *pRVar1;
  size_type in_RDX;
  
  if (in_RDX == 0) {
    pRVar1 = &nullrep_;
  }
  else {
    pRVar1 = (Rep *)operator_new__(in_RDX + 0x1b & 0xfffffffffffffffc);
    pRVar1->size = (size_type)ctx;
    pRVar1->str[(long)ctx] = '\0';
    pRVar1->capacity = in_RDX;
  }
  this->rep_ = pRVar1;
  return (int)pRVar1;
}

Assistant:

void init(size_type sz, size_type cap)
	{
		if (cap)
		{
			// Lee: the original form:
			//	rep_ = static_cast<Rep*>(operator new(sizeof(Rep) + cap));
			// doesn't work in some cases of new being overloaded. Switching
			// to the normal allocation, although use an 'int' for systems
			// that are overly picky about structure alignment.
			const size_type bytesNeeded = sizeof(Rep) + cap;
			const size_type intsNeeded = ( bytesNeeded + sizeof(int) - 1 ) / sizeof( int ); 
			rep_ = reinterpret_cast<Rep*>( new int[ intsNeeded ] );

			rep_->str[ rep_->size = sz ] = '\0';
			rep_->capacity = cap;
		}
		else
		{
			rep_ = &nullrep_;
		}
	}